

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_dir.c
# Opt level: O0

PHYSFS_EnumerateCallbackResult
DIR_enumerate(void *opaque,char *dname,PHYSFS_EnumerateCallback cb,char *origdir,void *callbackdata)

{
  undefined1 *ptr;
  char *pcVar1;
  PHYSFS_EnumerateCallback path;
  size_t buflen;
  void *origdir_00;
  size_t sVar2;
  ulong len_00;
  char *pcVar3;
  char *dirname;
  undefined1 **ppuVar4;
  undefined1 *local_78;
  size_t local_70;
  char *local_68;
  PHYSFS_EnumerateCallback local_60;
  size_t local_58;
  size_t local_50;
  size_t len;
  char *pcStack_40;
  PHYSFS_EnumerateCallbackResult retval;
  char *d;
  void *callbackdata_local;
  char *origdir_local;
  PHYSFS_EnumerateCallback cb_local;
  char *dname_local;
  void *opaque_local;
  
  ppuVar4 = &local_78;
  d = (char *)callbackdata;
  callbackdata_local = origdir;
  origdir_local = (char *)cb;
  cb_local = (PHYSFS_EnumerateCallback)dname;
  dname_local = (char *)opaque;
  if (opaque == (void *)0x0) {
    local_58 = 0;
  }
  else {
    local_58 = strlen((char *)opaque);
  }
  local_70 = local_58;
  sVar2 = strlen((char *)cb_local);
  len_00 = local_70 + sVar2 + 1;
  local_68 = dname_local;
  local_60 = cb_local;
  if (len_00 < 0x100) {
    ppuVar4 = (undefined1 **)((long)&local_78 - (local_70 + sVar2 + 0x18 & 0xfffffffffffffff0));
    local_78 = (undefined1 *)ppuVar4;
  }
  else {
    local_78 = (undefined1 *)0x0;
  }
  ptr = local_78;
  local_50 = len_00;
  *(undefined8 *)((long)ppuVar4 + -8) = 0x1113b7;
  pcVar3 = (char *)__PHYSFS_initSmallAlloc(ptr,len_00);
  buflen = local_50;
  path = local_60;
  pcVar1 = local_68;
  *(undefined8 *)((long)ppuVar4 + -8) = 0x1113cb;
  dirname = cvtToDependent(pcVar1,(char *)path,pcVar3,buflen);
  pcVar3 = origdir_local;
  origdir_00 = callbackdata_local;
  pcVar1 = d;
  if (dirname == (char *)0x0) {
    opaque_local._4_4_ = PHYSFS_ENUM_ERROR;
  }
  else {
    pcStack_40 = dirname;
    *(undefined8 *)((long)ppuVar4 + -8) = 0x1113f6;
    len._4_4_ = __PHYSFS_platformEnumerate
                          (dirname,(PHYSFS_EnumerateCallback)pcVar3,(char *)origdir_00,pcVar1);
    pcVar1 = pcStack_40;
    *(undefined8 *)((long)ppuVar4 + -8) = 0x111402;
    __PHYSFS_smallFree(pcVar1);
    opaque_local._4_4_ = len._4_4_;
  }
  return opaque_local._4_4_;
}

Assistant:

static PHYSFS_EnumerateCallbackResult DIR_enumerate(void *opaque,
                         const char *dname, PHYSFS_EnumerateCallback cb,
                         const char *origdir, void *callbackdata)
{
    char *d;
    PHYSFS_EnumerateCallbackResult retval;
    CVT_TO_DEPENDENT(d, opaque, dname);
    BAIL_IF_ERRPASS(!d, PHYSFS_ENUM_ERROR);
    retval = __PHYSFS_platformEnumerate(d, cb, origdir, callbackdata);
    __PHYSFS_smallFree(d);
    return retval;
}